

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.cpp
# Opt level: O0

ec_point __thiscall jbcoin::openssl::multiply(openssl *this,EC_GROUP *group,bignum *n,bn_ctx *ctx)

{
  int iVar1;
  EC_POINT *r;
  BIGNUM *n_00;
  BN_CTX *ctx_00;
  bn_ctx *ctx_local;
  bignum *n_local;
  EC_GROUP *group_local;
  ec_point *result;
  
  ec_point::ec_point((ec_point *)this,group);
  r = ec_point::get((ec_point *)this);
  n_00 = (BIGNUM *)bignum::get(n);
  ctx_00 = bn_ctx::get(ctx);
  iVar1 = EC_POINT_mul((EC_GROUP *)group,(EC_POINT *)r,n_00,(EC_POINT *)0x0,(BIGNUM *)0x0,
                       (BN_CTX *)ctx_00);
  if (iVar1 != 0) {
    return (ec_point)(pointer_t)this;
  }
  Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"EC_POINT_mul() failed");
}

Assistant:

ec_point multiply (EC_GROUP const* group,
                   bignum const& n,
                   bn_ctx& ctx)
{
    ec_point result (group);
    if (! EC_POINT_mul (group, result.get(), n.get(), nullptr, nullptr, ctx.get()))
        Throw<std::runtime_error> ("EC_POINT_mul() failed");

    return result;
}